

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall FxPlusSign::FxPlusSign(FxPlusSign *this,FxExpression *operand)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition
            (&(this->super_FxExpression).ScriptPosition,&operand->ScriptPosition);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_PlusSign;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxPlusSign_0070f888;
  this->Operand = operand;
  return;
}

Assistant:

FxPlusSign::FxPlusSign(FxExpression *operand)
: FxExpression(EFX_PlusSign, operand->ScriptPosition)
{
	Operand=operand;
}